

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_Init(ARKodeMem ark_mem,sunrealtype tout,int init_type)

{
  int iVar1;
  int iVar2;
  N_Vector p_Var3;
  void *pvVar4;
  ARKTimestepSetPredictorMethod p_Var5;
  ARKTimestepSetMaxNonlinIters p_Var6;
  ARKTimestepGetNumNonlinSolvConvFails p_Var7;
  ARKTimestepGetNonlinSolvStats p_Var8;
  code *pcVar9;
  sunrealtype *extraout_RDX;
  sunrealtype *extraout_RDX_00;
  sunrealtype *extraout_RDX_01;
  sunrealtype *extraout_RDX_02;
  sunrealtype *extraout_RDX_03;
  sunrealtype *extraout_RDX_04;
  sunrealtype *extraout_RDX_05;
  sunrealtype *extraout_RDX_06;
  sunrealtype *extraout_RDX_07;
  sunrealtype *extraout_RDX_08;
  sunrealtype *extraout_RDX_09;
  sunrealtype *extraout_RDX_10;
  sunrealtype *psVar10;
  sunrealtype *extraout_RDX_11;
  sunrealtype *extraout_RDX_12;
  int in_ESI;
  char *pcVar11;
  ARKodeMem in_RDI;
  int *in_R8;
  ARKodeMem in_XMM0_Qa;
  int reset_efun;
  int retval;
  int j;
  ARKodeARKStepMem step_mem;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar12;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar13;
  ARKodeMem in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pcVar11 = "arkStep_Init";
  iVar1 = arkStep_AccessStepMem
                    (in_stack_ffffffffffffffd8,
                     (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (ARKodeARKStepMem *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (iVar1 == 0) {
    if (in_ESI == 1) {
      iVar1 = 0;
    }
    else {
      psVar10 = extraout_RDX;
      if (in_ESI == 0) {
        uVar12 = (uint)(*(int *)&in_stack_ffffffffffffffd8->reltol == 0);
        if (in_RDI->fixedstep == 0) {
          uVar12 = 0;
        }
        if (in_RDI->user_efun != 0) {
          uVar12 = 0;
        }
        if (in_RDI->AccumErrorType != ARK_ACCUMERROR_NONE) {
          uVar12 = 0;
        }
        if ((in_RDI->rwt_is_ewt != 0) &&
           (*(int *)((long)&in_stack_ffffffffffffffd8->step_setnlsrhsfn + 4) == 1)) {
          uVar12 = 0;
        }
        if ((in_RDI->rwt_is_ewt != 0) &&
           (*(int *)((long)&in_stack_ffffffffffffffd8->step_setnlsrhsfn + 4) == 2)) {
          uVar12 = 0;
        }
        if (uVar12 != 0) {
          in_RDI->user_efun = 0;
          in_RDI->efun = arkEwtSetSmallReal;
          in_RDI->e_data = in_RDI;
        }
        iVar1 = arkStep_SetButcherTables
                          ((ARKodeMem)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
        ;
        if (iVar1 != 0) {
          arkProcessError(in_RDI,-0x16,0x3de,"arkStep_Init",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                          ,"Could not create Butcher table(s)");
          return -0x16;
        }
        iVar1 = arkStep_CheckButcherTables(in_XMM0_Qa);
        if (iVar1 != 0) {
          arkProcessError(in_RDI,-0x16,999,"arkStep_Init",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                          ,"Error in Butcher table(s)");
          return -0x16;
        }
        if (in_stack_ffffffffffffffd8->r_data == (void *)0x0) {
          iVar13 = *(int *)in_stack_ffffffffffffffd8->rfun;
          in_RDI->hadapt_mem->q = iVar13;
          *(int *)&in_stack_ffffffffffffffd8->e_data = iVar13;
          iVar13 = *(int *)(in_stack_ffffffffffffffd8->rfun + 4);
          in_RDI->hadapt_mem->p = iVar13;
          *(int *)((long)&in_stack_ffffffffffffffd8->e_data + 4) = iVar13;
        }
        else {
          iVar13 = *in_stack_ffffffffffffffd8->r_data;
          in_RDI->hadapt_mem->q = iVar13;
          *(int *)&in_stack_ffffffffffffffd8->e_data = iVar13;
          iVar13 = *(int *)((long)in_stack_ffffffffffffffd8->r_data + 4);
          in_RDI->hadapt_mem->p = iVar13;
          *(int *)((long)&in_stack_ffffffffffffffd8->e_data + 4) = iVar13;
        }
        if (((in_RDI->fixedstep == 0) || (in_RDI->AccumErrorType != ARK_ACCUMERROR_NONE)) &&
           (*(int *)((long)&in_stack_ffffffffffffffd8->e_data + 4) < 1)) {
          arkProcessError(in_RDI,-0x16,0x3fd,"arkStep_Init",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                          ,
                          "Temporal error estimation cannot be performed without embedding coefficients"
                         );
          return -0x16;
        }
        if (((in_RDI->relax_enabled != 0) && (*(int *)&in_stack_ffffffffffffffd8->reltol != 0)) &&
           (*(int *)((long)&in_stack_ffffffffffffffd8->reltol + 4) != 0)) {
          arkProcessError(in_RDI,-0x16,0x405,"arkStep_Init",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                          ,"Relaxation cannot be performed when deducing implicit RHS values");
          return -0x16;
        }
        psVar10 = extraout_RDX_00;
        if (in_stack_ffffffffffffffd8->ritol != 0) {
          if (in_stack_ffffffffffffffd8->Vabstol == (N_Vector)0x0) {
            pcVar11 = (char *)0x8;
            p_Var3 = (N_Vector)calloc((long)*(int *)&in_stack_ffffffffffffffd8->field_0x6c,8);
            in_stack_ffffffffffffffd8->Vabstol = p_Var3;
            psVar10 = extraout_RDX_01;
          }
          for (iVar13 = 0; iVar13 < *(int *)&in_stack_ffffffffffffffd8->field_0x6c;
              iVar13 = iVar13 + 1) {
            pcVar11 = (char *)in_RDI->ewt;
            iVar2 = arkAllocVec(in_stack_ffffffffffffffd8,(N_Vector)CONCAT44(iVar13,iVar1),
                                (N_Vector *)CONCAT44(uVar12,in_stack_ffffffffffffffc8));
            if (iVar2 == 0) {
              return -0x14;
            }
            psVar10 = extraout_RDX_02;
          }
          in_RDI->liw = (long)*(int *)&in_stack_ffffffffffffffd8->field_0x6c + in_RDI->liw;
        }
        if (*(int *)&in_stack_ffffffffffffffd8->reltol != 0) {
          if (*(long *)&in_stack_ffffffffffffffd8->atolmin0 == 0) {
            pcVar11 = (char *)0x8;
            pvVar4 = calloc((long)*(int *)&in_stack_ffffffffffffffd8->field_0x6c,8);
            *(void **)&in_stack_ffffffffffffffd8->atolmin0 = pvVar4;
            psVar10 = extraout_RDX_03;
          }
          for (iVar13 = 0; iVar13 < *(int *)&in_stack_ffffffffffffffd8->field_0x6c;
              iVar13 = iVar13 + 1) {
            pcVar11 = (char *)in_RDI->ewt;
            iVar2 = arkAllocVec(in_stack_ffffffffffffffd8,(N_Vector)CONCAT44(iVar13,iVar1),
                                (N_Vector *)CONCAT44(uVar12,in_stack_ffffffffffffffc8));
            if (iVar2 == 0) {
              return -0x14;
            }
            psVar10 = extraout_RDX_04;
          }
          in_RDI->liw = (long)*(int *)&in_stack_ffffffffffffffd8->field_0x6c + in_RDI->liw;
        }
        if ((in_RDI->relax_enabled != 0) &&
           ((*(int *)&in_stack_ffffffffffffffd8->reltol != 0 ||
            (*(int *)&in_stack_ffffffffffffffd8->step_setnlsrhsfn == 1)))) {
          if (in_stack_ffffffffffffffd8->SRabstol == 0.0) {
            pcVar11 = (char *)0x8;
            pvVar4 = calloc((long)*(int *)&in_stack_ffffffffffffffd8->field_0x6c,8);
            in_stack_ffffffffffffffd8->SRabstol = (sunrealtype)pvVar4;
            psVar10 = extraout_RDX_05;
          }
          for (iVar13 = 0; iVar13 < *(int *)&in_stack_ffffffffffffffd8->field_0x6c;
              iVar13 = iVar13 + 1) {
            pcVar11 = (char *)in_RDI->ewt;
            iVar2 = arkAllocVec(in_stack_ffffffffffffffd8,(N_Vector)CONCAT44(iVar13,iVar1),
                                (N_Vector *)CONCAT44(uVar12,in_stack_ffffffffffffffc8));
            if (iVar2 == 0) {
              return -0x14;
            }
            psVar10 = extraout_RDX_06;
          }
          in_RDI->liw = (long)*(int *)&in_stack_ffffffffffffffd8->field_0x6c + in_RDI->liw;
        }
        *(int *)&in_stack_ffffffffffffffd8->step_setnonlinconvcoef =
             *(int *)&in_stack_ffffffffffffffd8->field_0x6c * 2 + 2 +
             *(int *)&in_stack_ffffffffffffffd8->step_getnumnonlinsolviters;
        if (in_stack_ffffffffffffffd8->step_setpredictormethod == (ARKTimestepSetPredictorMethod)0x0
           ) {
          pcVar11 = (char *)0x8;
          p_Var5 = (ARKTimestepSetPredictorMethod)
                   calloc((long)*(int *)&in_stack_ffffffffffffffd8->step_setnonlinconvcoef,8);
          in_stack_ffffffffffffffd8->step_setpredictormethod = p_Var5;
          if (in_stack_ffffffffffffffd8->step_setpredictormethod ==
              (ARKTimestepSetPredictorMethod)0x0) {
            return -0x14;
          }
          in_RDI->lrw = (long)*(int *)&in_stack_ffffffffffffffd8->step_setnonlinconvcoef +
                        in_RDI->lrw;
          psVar10 = extraout_RDX_07;
        }
        if (in_stack_ffffffffffffffd8->step_setmaxnonliniters == (ARKTimestepSetMaxNonlinIters)0x0)
        {
          pcVar11 = (char *)0x8;
          p_Var6 = (ARKTimestepSetMaxNonlinIters)
                   calloc((long)*(int *)&in_stack_ffffffffffffffd8->step_setnonlinconvcoef,8);
          in_stack_ffffffffffffffd8->step_setmaxnonliniters = p_Var6;
          if (in_stack_ffffffffffffffd8->step_setmaxnonliniters == (ARKTimestepSetMaxNonlinIters)0x0
             ) {
            return -0x14;
          }
          in_RDI->liw = (long)*(int *)&in_stack_ffffffffffffffd8->step_setnonlinconvcoef +
                        in_RDI->liw;
          psVar10 = extraout_RDX_08;
        }
        if ((*(int *)((long)&in_stack_ffffffffffffffd8->step_setnonlinconvcoef + 4) != 0) ||
           (*(int *)&in_stack_ffffffffffffffd8->step_setstagepredictfn != 0)) {
          if (in_stack_ffffffffffffffd8->step_getnumnonlinsolvconvfails ==
              (ARKTimestepGetNumNonlinSolvConvFails)0x0) {
            pcVar11 = (char *)0x8;
            p_Var7 = (ARKTimestepGetNumNonlinSolvConvFails)
                     calloc((long)*(int *)&in_stack_ffffffffffffffd8->field_0x6c,8);
            in_stack_ffffffffffffffd8->step_getnumnonlinsolvconvfails = p_Var7;
            in_RDI->lrw = (long)*(int *)&in_stack_ffffffffffffffd8->field_0x6c + in_RDI->lrw;
            psVar10 = extraout_RDX_09;
          }
          if (in_stack_ffffffffffffffd8->step_getnonlinsolvstats ==
              (ARKTimestepGetNonlinSolvStats)0x0) {
            pcVar11 = (char *)0x8;
            p_Var8 = (ARKTimestepGetNonlinSolvStats)
                     calloc((long)*(int *)&in_stack_ffffffffffffffd8->field_0x6c,8);
            in_stack_ffffffffffffffd8->step_getnonlinsolvstats = p_Var8;
            in_RDI->lrw = (long)*(int *)&in_stack_ffffffffffffffd8->field_0x6c + in_RDI->lrw;
            psVar10 = extraout_RDX_10;
          }
        }
        if ((*(int *)&in_stack_ffffffffffffffd8->e_data < 2) ||
           (in_RDI->interp_degree <= *(int *)&in_stack_ffffffffffffffd8->e_data + -1)) {
          if ((*(int *)&in_stack_ffffffffffffffd8->e_data == 1) && (1 < in_RDI->interp_degree)) {
            in_RDI->interp_degree = 1;
          }
        }
        else {
          in_RDI->interp_degree = *(int *)&in_stack_ffffffffffffffd8->e_data + -1;
        }
        if ((in_RDI->interp_type == -1) && (*(int *)&in_stack_ffffffffffffffd8->step_resize != 0)) {
          arkProcessError(in_RDI,-0x16,0x476,"arkStep_Init",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                          ,"Non-trival predictors require an interpolation module");
          return -0x16;
        }
      }
      if (in_RDI->do_adjoint == 0) {
        pcVar9 = arkStep_TakeStep_Z;
        in_RDI->step = arkStep_TakeStep_Z;
      }
      else {
        pcVar9 = arkStep_TakeStep_ERK_Adjoint;
        in_RDI->step = arkStep_TakeStep_ERK_Adjoint;
      }
      if (((*(int *)&in_stack_ffffffffffffffd8->step_setnlsrhsfn == 0) ||
          (in_stack_ffffffffffffffd8->step_getlinmem == (ARKTimestepGetLinMemFn)0x0)) ||
         (pcVar9 = (code *)in_stack_ffffffffffffffd8,
         *(int *)&in_stack_ffffffffffffffd8->step_getimplicitrhs ==
         *(int *)((long)&in_stack_ffffffffffffffd8->step_setnlsrhsfn + 4))) {
        if (*(int *)&in_stack_ffffffffffffffd8->step_setnlsrhsfn != 0) {
          if ((in_stack_ffffffffffffffd8->step_getgammas != (ARKTimestepGetGammasFn)0x0) &&
             (iVar1 = (*in_stack_ffffffffffffffd8->step_getgammas)
                                (in_RDI,(sunrealtype *)pcVar11,psVar10,(int **)pcVar9,in_R8),
             psVar10 = extraout_RDX_11, iVar1 != 0)) {
            arkProcessError(in_RDI,-0xe,0x495,"arkStep_Init",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                            ,"The mass matrix solver\'s init routine failed.");
            return -0xe;
          }
          if (in_stack_ffffffffffffffd8->step_computestate != (ARKTimestepComputeState)0x0) {
            pcVar11 = (char *)in_RDI->tempv1;
            iVar1 = (*in_stack_ffffffffffffffd8->step_computestate)
                              (in_RDI,(N_Vector)pcVar11,in_RDI->tempv2);
            psVar10 = extraout_RDX_12;
            if (iVar1 != 0) {
              arkProcessError(in_RDI,-0xf,0x4a2,"arkStep_Init",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                              ,"The mass matrix solver\'s setup routine failed.");
              return -0xf;
            }
          }
        }
        if ((in_stack_ffffffffffffffd8->step_setrelaxfn == (ARKTimestepSetRelaxFn)0x0) ||
           (iVar1 = (*in_stack_ffffffffffffffd8->step_setrelaxfn)
                              (in_RDI,(ARKRelaxFn)pcVar11,(ARKRelaxJacFn)psVar10), iVar1 == 0)) {
          if ((in_stack_ffffffffffffffd8->step_mem == (void *)0x0) ||
             (iVar1 = arkStep_NlsInit(in_stack_ffffffffffffffd8), iVar1 == 0)) {
            in_RDI->call_fullrhs = 1;
            iVar1 = 0;
          }
          else {
            arkProcessError(in_RDI,-0x1d,0x4bb,"arkStep_Init",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                            ,"Unable to initialize SUNNonlinearSolver object");
            iVar1 = -0x1d;
          }
        }
        else {
          arkProcessError(in_RDI,-5,0x4af,"arkStep_Init",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                          ,"The linear solver\'s init routine failed.");
          iVar1 = -5;
        }
      }
      else {
        arkProcessError(in_RDI,-0x16,0x486,"arkStep_Init",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                        ,"Incompatible linear and mass matrix solvers");
        iVar1 = -0x16;
      }
    }
  }
  return iVar1;
}

Assistant:

int arkStep_Init(ARKodeMem ark_mem, SUNDIALS_MAYBE_UNUSED sunrealtype tout,
                 int init_type)
{
  ARKodeARKStepMem step_mem;
  int j, retval;
  sunbooleantype reset_efun;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* immediately return if reset */
  if (init_type == RESET_INIT) { return (ARK_SUCCESS); }

  /* initializations/checks for (re-)initialization call */
  if (init_type == FIRST_INIT)
  {
    /* enforce use of arkEwtSmallReal if using a fixed step size for
       an explicit method, an internal error weight function, not
       using an iterative mass matrix solver with rwt=ewt, and not
       performing accumulated temporal error estimation */
    reset_efun = SUNTRUE;
    if (step_mem->implicit) { reset_efun = SUNFALSE; }
    if (!ark_mem->fixedstep) { reset_efun = SUNFALSE; }
    if (ark_mem->user_efun) { reset_efun = SUNFALSE; }
    if (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE)
    {
      reset_efun = SUNFALSE;
    }
    if (ark_mem->rwt_is_ewt &&
        (step_mem->msolve_type == SUNLINEARSOLVER_ITERATIVE))
    {
      reset_efun = SUNFALSE;
    }
    if (ark_mem->rwt_is_ewt &&
        (step_mem->msolve_type == SUNLINEARSOLVER_MATRIX_ITERATIVE))
    {
      reset_efun = SUNFALSE;
    }
    if (reset_efun)
    {
      ark_mem->user_efun = SUNFALSE;
      ark_mem->efun      = arkEwtSetSmallReal;
      ark_mem->e_data    = ark_mem;
    }

    /* Create Butcher tables (if not already set) */
    retval = arkStep_SetButcherTables(ark_mem);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Could not create Butcher table(s)");
      return (ARK_ILL_INPUT);
    }

    /* Check that Butcher tables are OK */
    retval = arkStep_CheckButcherTables(ark_mem);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Error in Butcher table(s)");
      return (ARK_ILL_INPUT);
    }

    /* Retrieve/store method and embedding orders now that tables are finalized */
    if (step_mem->Bi != NULL)
    {
      step_mem->q = ark_mem->hadapt_mem->q = step_mem->Bi->q;
      step_mem->p = ark_mem->hadapt_mem->p = step_mem->Bi->p;
    }
    else
    {
      step_mem->q = ark_mem->hadapt_mem->q = step_mem->Be->q;
      step_mem->p = ark_mem->hadapt_mem->p = step_mem->Be->p;
    }

    /* Ensure that if adaptivity or error accumulation is enabled, then
       method includes embedding coefficients */
    if ((!ark_mem->fixedstep || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE)) &&
        (step_mem->p <= 0))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                      __FILE__, "Temporal error estimation cannot be performed without embedding coefficients");
      return (ARK_ILL_INPUT);
    }

    /* Relaxation is incompatible with implicit RHS deduction */
    if (ark_mem->relax_enabled && step_mem->implicit && step_mem->deduce_rhs)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                      __FILE__, "Relaxation cannot be performed when deducing implicit RHS values");
      return ARK_ILL_INPUT;
    }

    /* Allocate ARK RHS vector memory, update storage requirements */
    /*   Allocate Fe[0] ... Fe[stages-1] if needed */
    if (step_mem->explicit)
    {
      if (step_mem->Fe == NULL)
      {
        step_mem->Fe = (N_Vector*)calloc(step_mem->stages, sizeof(N_Vector));
      }
      for (j = 0; j < step_mem->stages; j++)
      {
        if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->Fe[j])))
        {
          return (ARK_MEM_FAIL);
        }
      }
      ark_mem->liw += step_mem->stages; /* pointers */
    }

    /*   Allocate Fi[0] ... Fi[stages-1] if needed */
    if (step_mem->implicit)
    {
      if (step_mem->Fi == NULL)
      {
        step_mem->Fi = (N_Vector*)calloc(step_mem->stages, sizeof(N_Vector));
      }
      for (j = 0; j < step_mem->stages; j++)
      {
        if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->Fi[j])))
        {
          return (ARK_MEM_FAIL);
        }
      }
      ark_mem->liw += step_mem->stages; /* pointers */
    }

    /* Allocate stage storage for relaxation with implicit/IMEX methods or if a
       fixed mass matrix is present (since we store f(t,y) not M^{-1} f(t,y)) */
    if (ark_mem->relax_enabled &&
        (step_mem->implicit || step_mem->mass_type == MASS_FIXED))
    {
      if (step_mem->z == NULL)
      {
        step_mem->z = (N_Vector*)calloc(step_mem->stages, sizeof(N_Vector));
      }
      for (j = 0; j < step_mem->stages; j++)
      {
        if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->z[j])))
        {
          return (ARK_MEM_FAIL);
        }
      }
      ark_mem->liw += step_mem->stages; /* pointers */
    }

    /* Allocate reusable arrays for fused vector operations */
    step_mem->nfusedopvecs = 2 * step_mem->stages + 2 + step_mem->nforcing;
    if (step_mem->cvals == NULL)
    {
      step_mem->cvals = (sunrealtype*)calloc(step_mem->nfusedopvecs,
                                             sizeof(sunrealtype));
      if (step_mem->cvals == NULL) { return (ARK_MEM_FAIL); }
      ark_mem->lrw += step_mem->nfusedopvecs;
    }
    if (step_mem->Xvecs == NULL)
    {
      step_mem->Xvecs = (N_Vector*)calloc(step_mem->nfusedopvecs,
                                          sizeof(N_Vector));
      if (step_mem->Xvecs == NULL) { return (ARK_MEM_FAIL); }
      ark_mem->liw += step_mem->nfusedopvecs; /* pointers */
    }

    /* Allocate workspace for MRI forcing -- need to allocate here as the
       number of stages may not bet set before this point and we assume
       SetInnerForcing has been called before the first step i.e., methods
       start with a fast integration */
    if (step_mem->expforcing || step_mem->impforcing)
    {
      if (!(step_mem->stage_times))
      {
        step_mem->stage_times = (sunrealtype*)calloc(step_mem->stages,
                                                     sizeof(sunrealtype));
        ark_mem->lrw += step_mem->stages;
      }

      if (!(step_mem->stage_coefs))
      {
        step_mem->stage_coefs = (sunrealtype*)calloc(step_mem->stages,
                                                     sizeof(sunrealtype));
        ark_mem->lrw += step_mem->stages;
      }
    }

    /* Override the interpolant degree (if needed), used in arkInitialSetup */
    if (step_mem->q > 1 && ark_mem->interp_degree > (step_mem->q - 1))
    {
      /* Limit max degree to at most one less than the method global order */
      ark_mem->interp_degree = step_mem->q - 1;
    }
    else if (step_mem->q == 1 && ark_mem->interp_degree > 1)
    {
      /* Allow for linear interpolant with first order methods to ensure
         solution values are returned at the time interval end points */
      ark_mem->interp_degree = 1;
    }

    /* Higher-order predictors require interpolation */
    if (ark_mem->interp_type == ARK_INTERP_NONE && step_mem->predictor != 0)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Non-trival predictors require an interpolation module");
      return ARK_ILL_INPUT;
    }
  }

  /* set appropriate TakeStep routine based on problem configuration */
  if (ark_mem->do_adjoint) { ark_mem->step = arkStep_TakeStep_ERK_Adjoint; }
  else { ark_mem->step = arkStep_TakeStep_Z; }

  /* Check for consistency between mass system and system linear system modules
     (e.g., if lsolve is direct, msolve needs to match) */
  if ((step_mem->mass_type != MASS_IDENTITY) && step_mem->lmem)
  {
    if (step_mem->lsolve_type != step_mem->msolve_type)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Incompatible linear and mass matrix solvers");
      return (ARK_ILL_INPUT);
    }
  }

  /* Perform mass matrix solver initialization and setup (if applicable) */
  if (step_mem->mass_type != MASS_IDENTITY)
  {
    /* Call minit (if it exists) */
    if (step_mem->minit != NULL)
    {
      retval = step_mem->minit((void*)ark_mem);
      if (retval != 0)
      {
        arkProcessError(ark_mem, ARK_MASSINIT_FAIL, __LINE__, __func__,
                        __FILE__, MSG_ARK_MASSINIT_FAIL);
        return (ARK_MASSINIT_FAIL);
      }
    }

    /* Call msetup (if it exists) */
    if (step_mem->msetup != NULL)
    {
      retval = step_mem->msetup((void*)ark_mem, ark_mem->tcur, ark_mem->tempv1,
                                ark_mem->tempv2, ark_mem->tempv3);
      if (retval != 0)
      {
        arkProcessError(ark_mem, ARK_MASSSETUP_FAIL, __LINE__, __func__,
                        __FILE__, MSG_ARK_MASSSETUP_FAIL);
        return (ARK_MASSSETUP_FAIL);
      }
    }
  }

  /* Call linit (if it exists) */
  if (step_mem->linit)
  {
    retval = step_mem->linit(ark_mem);
    if (retval != 0)
    {
      arkProcessError(ark_mem, ARK_LINIT_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_LINIT_FAIL);
      return (ARK_LINIT_FAIL);
    }
  }

  /* Initialize the nonlinear solver object (if it exists) */
  if (step_mem->NLS)
  {
    retval = arkStep_NlsInit(ark_mem);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_NLS_INIT_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to initialize SUNNonlinearSolver object");
      return (ARK_NLS_INIT_FAIL);
    }
  }

  /* Signal to shared arkode module that full RHS evaluations are required */
  ark_mem->call_fullrhs = SUNTRUE;

  return (ARK_SUCCESS);
}